

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symArrays.cpp
# Opt level: O2

bool ValidInput(char **argv,int *numbers)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  bool bVar4;
  int i;
  long lVar5;
  char *endPtr;
  
  bVar4 = true;
  lVar5 = 1;
  do {
    if (lVar5 == 4) {
      return bVar4;
    }
    lVar1 = strtol(argv[lVar5],&endPtr,10);
    if (lVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Invalid num at argument ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar5);
      pcVar3 = "!";
LAB_001014bb:
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
      bVar4 = false;
    }
    else {
      lVar1 = strtol(argv[lVar5],&endPtr,10);
      numbers[lVar5 + -1] = (int)lVar1;
      if ((int)lVar1 < 1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Invalid num at argument ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar5);
        poVar2 = std::operator<<(poVar2,"!");
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = (ostream *)&std::cout;
        pcVar3 = "Numbers must be positive.";
        goto LAB_001014bb;
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

bool ValidInput(char *argv[], int numbers[])
{
    bool validNumbers = true;

    for(int i = 1; i < 4; i++)
    {

        char *endPtr;
        if(strtol(argv[i], &endPtr, 10))
        {
            numbers[i - 1] = static_cast<int>(strtol(argv[i], &endPtr, 10));

            if(numbers[i - 1] <= 0)
            {
                cout << "Invalid num at argument " << i << "!" << endl;
                cout << "Numbers must be positive." << endl;
                validNumbers = false;
            }
        }
        else
        {
            cout << "Invalid num at argument " << i << "!" << endl;
            validNumbers = false;
        }
    }

    return validNumbers;

}